

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_Wcsicmp_Test::Body(iu_UnitStringTest_x_iutest_x_Wcsicmp_Test *this)

{
  int *in_R9;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = wcscasecmp(L"AAA",L"aaa");
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x169a26,"::iutest::detail::iu_wcsicmp(L\"AAA\", L\"aaa\")",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x36,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = wcscasecmp(L"AAAa",L"aaa");
  iutest::internal::CmpHelperLT<int,int>
            (&iutest_ar,(internal *)0x169a26,"::iutest::detail::iu_wcsicmp(L\"AAAa\", L\"aaa\")",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x37,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = wcscasecmp(L"AAAB",L"aaaa");
  iutest::internal::CmpHelperLT<int,int>
            (&iutest_ar,(internal *)0x169a26,"::iutest::detail::iu_wcsicmp(L\"AAAB\", L\"aaaa\")",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x38,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = wcscasecmp(L"AAAa",L"aaaB");
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x169a26,"::iutest::detail::iu_wcsicmp(L\"AAAa\", L\"aaaB\")",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x39,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = wcscasecmp(L"AAA",L"aaaA");
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x169a26,"::iutest::detail::iu_wcsicmp(L\"AAA\", L\"aaaA\")",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x3a,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, Wcsicmp)
{
    IUTEST_EXPECT_EQ(0, ::iutest::detail::iu_wcsicmp(L"AAA", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAAa", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAAB", L"aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::iu_wcsicmp(L"AAAa", L"aaaB"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::iu_wcsicmp(L"AAA", L"aaaA"));
}